

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int pager_unlink_page(Pager *pPager,Page *pPage)

{
  Page *pPVar1;
  Page **ppPVar2;
  
  pPVar1 = pPage->pNextCollide;
  if (pPVar1 != (Page *)0x0) {
    pPVar1->pPrevCollide = pPage->pPrevCollide;
  }
  if (pPage->pPrevCollide == (Page *)0x0) {
    ppPVar2 = pPager->apHash + (pPager->nSize - 1 & (uint)pPage->pgno);
  }
  else {
    ppPVar2 = &pPage->pPrevCollide->pNextCollide;
  }
  *ppPVar2 = pPVar1;
  if (pPager->pAll == pPage) {
    pPager->pAll = pPager->pAll->pNext;
  }
  pPVar1 = pPage->pPrev;
  if (pPVar1 != (Page *)0x0) {
    pPVar1->pNext = pPage->pNext;
  }
  if (pPage->pNext != (Page *)0x0) {
    pPage->pNext->pPrev = pPVar1;
  }
  pPager->nPage = pPager->nPage - 1;
  return (int)pPVar1;
}

Assistant:

static int pager_unlink_page(Pager *pPager,Page *pPage)
{
	if( pPage->pNextCollide ){
		pPage->pNextCollide->pPrevCollide = pPage->pPrevCollide;
	}
	if( pPage->pPrevCollide ){
		pPage->pPrevCollide->pNextCollide = pPage->pNextCollide;
	}else{
		sxu32 nBucket = PAGE_HASH(pPage->pgno) & (pPager->nSize - 1);
		pPager->apHash[nBucket] = pPage->pNextCollide;
	}
	MACRO_LD_REMOVE(pPager->pAll,pPage);
	pPager->nPage--;
	return UNQLITE_OK;
}